

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_suite.cpp
# Opt level: O0

void test_boolean(void)

{
  index_type *this;
  undefined4 local_d4;
  iterator local_d0;
  iterator local_b8;
  difference_type local_a0 [2];
  iterator local_90;
  iterator local_68;
  undefined1 local_50 [8];
  iterator end;
  variable data;
  
  this = &end.
          super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
          .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)this,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_68,(basic_variable<std::allocator<char>_> *)this);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_90,
             (basic_variable<std::allocator<char>_> *)
             &end.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::unique<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_50,&local_68,&local_90);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_90);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_b8,
             (basic_variable<std::allocator<char>_> *)
             &end.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_d0,(iterator *)local_50);
  local_a0[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                          (&local_b8,&local_d0);
  local_d4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), end)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/unique_suite.cpp"
             ,0x20,"void test_boolean()",local_a0,&local_d4);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &end.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  return;
}

Assistant:

void test_boolean()
{
    variable data(true);
    auto end = std::unique(data.begin(), data.end());
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), end), 1);
}